

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O3

MPI_Request * __thiscall mxx::requests::add(requests *this)

{
  iterator __position;
  pointer ppoVar1;
  ompi_request_t *local_10;
  
  local_10 = (ompi_request_t *)0x0;
  __position._M_current =
       (this->m_requests).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_requests).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::_M_realloc_insert<ompi_request_t*>
              ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&this->m_requests,
               __position,&local_10);
    ppoVar1 = (this->m_requests).
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = (ompi_request_t *)0x0;
    ppoVar1 = (this->m_requests).
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish + 1;
    (this->m_requests).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppoVar1;
  }
  return ppoVar1 + -1;
}

Assistant:

MPI_Request& add() {
        m_requests.push_back(MPI_Request());
        return m_requests.back();
    }